

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.h
# Opt level: O0

bool __thiscall
BamTools::BamAlignment::GetTag<float>(BamAlignment *this,string *tag,float *destination)

{
  bool bVar1;
  ulong uVar2;
  undefined4 *in_RDX;
  uint *in_RDI;
  string message;
  int destinationLength;
  char type;
  uint numBytesParsed;
  uint tagDataLength;
  char *pTagData;
  RuleToken *in_stack_fffffffffffffed8;
  allocator *paVar3;
  uint *in_stack_fffffffffffffee8;
  char **in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  BamAlignment *in_stack_ffffffffffffff08;
  allocator local_d9;
  string local_d8 [8];
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  BamAlignment *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  int local_38;
  char local_31;
  undefined4 local_30;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  byte local_1;
  
  if ((in_RDI[0x4c] & 1) != 0) {
    local_1 = 0;
    goto LAB_00218a2f;
  }
  local_20 = in_RDX;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    local_1 = 0;
    goto LAB_00218a2f;
  }
  local_28 = (void *)std::__cxx11::string::data();
  local_2c = std::__cxx11::string::size();
  local_30 = 0;
  bVar1 = FindTag(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                  in_RDI,in_stack_fffffffffffffee8);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_00218a2f;
  }
  local_31 = *(char *)((long)local_28 + -1);
  bVar1 = TagTypeHelper<float>::CanConvertFrom(local_31);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_00218a2f;
  }
  local_38 = 0;
  switch(local_31) {
  case 'A':
  case 'C':
  case 'c':
    local_38 = 1;
    break;
  case 'B':
  case 'H':
  case 'Z':
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"BamAlignment::GetTag",&local_59);
    paVar3 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,"cannot store variable length tag data into a numeric destination",paVar3);
    SetErrorString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_1 = 0;
    goto LAB_00218a2f;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"invalid tag type: ",&local_d9);
    std::operator+(in_stack_fffffffffffffed8,(char)((ulong)&local_d9 >> 0x38));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff00,"BamAlignment::GetTag",
               (allocator *)&stack0xfffffffffffffeff);
    SetErrorString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
    local_1 = 0;
    std::__cxx11::string::~string(local_b8);
    goto LAB_00218a2f;
  case 'I':
  case 'f':
  case 'i':
    local_38 = 4;
    break;
  case 'S':
  case 's':
    local_38 = 2;
  }
  *local_20 = 0;
  memcpy(local_20,local_28,(long)local_38);
  local_1 = 1;
LAB_00218a2f:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool BamAlignment::GetTag(const std::string& tag, T& destination) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // return failure if tag not found
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // fetch data type
    const char type = *(pTagData - 1);
    if (!TagTypeHelper<T>::CanConvertFrom(type)) {
        // TODO: set error string ?
        return false;
    }

    // determine data length
    int destinationLength = 0;
    switch (type) {

        // 1 byte data
        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
            destinationLength = 1;
            break;

        // 2 byte data
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
            destinationLength = 2;
            break;

        // 4 byte data
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
            destinationLength = 4;
            break;

        // var-length types not supported for numeric destination
        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
        case (Constants::BAM_TAG_TYPE_ARRAY):
            SetErrorString("BamAlignment::GetTag",
                           "cannot store variable length tag data into a numeric destination");
            return false;

        // unrecognized tag type
        default:
            const std::string message = std::string("invalid tag type: ") + type;
            SetErrorString("BamAlignment::GetTag", message);
            return false;
    }

    // store data in destination
    destination = 0;
    memcpy(&destination, pTagData, destinationLength);

    // return success
    return true;
}